

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O1

void uS::Socket::io_cb<uWS::WebSocket<false>>(uv_poll_t *p,int status,int events)

{
  Queue *this;
  long *plVar1;
  long lVar2;
  Message *pMVar3;
  Socket in_RAX;
  ssize_t sVar4;
  int *piVar5;
  int iVar6;
  size_t sVar7;
  Socket in_stack_00000008;
  Socket s;
  
  if (status < 0) {
    uWS::WebSocket<false>::onEnd(in_stack_00000008);
    return;
  }
  plVar1 = (long *)p->data;
  lVar2 = *plVar1;
  if (((events & 2U) != 0) && (plVar1[4] != 0)) {
    this = (Queue *)(plVar1 + 4);
    s.p = (uv_poll_t *)CONCAT44((int)((ulong)in_RAX.p >> 0x20),1);
    setsockopt((p->io_watcher).fd,6,3,&stack0xffffffffffffffc8,4);
    do {
      pMVar3 = this->head;
      sVar4 = send((p->io_watcher).fd,pMVar3->data,pMVar3->length,0x4000);
      sVar7 = pMVar3->length - sVar4;
      if (sVar7 == 0) {
        if (pMVar3->callback != (_func_void_void_ptr_void_ptr_bool_void_ptr *)0x0) {
          (*pMVar3->callback)(p,pMVar3->callbackData,false,pMVar3->reserved);
        }
        SocketData::Queue::pop(this);
        iVar6 = 0;
        if (this->head == (Message *)0x0) {
          *(undefined4 *)(plVar1 + 3) = 1;
          uv_poll_start(p,1,p->poll_cb);
LAB_00116ac2:
          iVar6 = 3;
        }
      }
      else {
        if (sVar4 != -1) {
          pMVar3->length = sVar7;
          pMVar3->data = pMVar3->data + sVar4;
          goto LAB_00116ac2;
        }
        piVar5 = __errno_location();
        iVar6 = 3;
        if (*piVar5 != 0xb) {
          uWS::WebSocket<false>::onEnd(s);
          iVar6 = 1;
        }
      }
    } while (iVar6 == 0);
    if (iVar6 != 3) {
      return;
    }
    in_RAX.p = s.p & 0xffffffff;
    setsockopt((p->io_watcher).fd,6,3,&stack0xffffffffffffffcc,4);
  }
  if ((events & 1U) != 0) {
    sVar4 = recv((p->io_watcher).fd,*(void **)(lVar2 + 8),(long)*(int *)(lVar2 + 0x10),0);
    if ((int)sVar4 < 1) {
      uWS::WebSocket<false>::onEnd(in_RAX);
    }
    else {
      uWS::WebSocket<false>::onData((Socket)p,*(char **)(lVar2 + 8),(int)sVar4);
    }
  }
  return;
}

Assistant:

static void io_cb(uv_poll_t *p, int status, int events) {
        SocketData *socketData = Socket(p).getSocketData();
        NodeData *nodeData = socketData->nodeData;

        if (status < 0) {
            STATE::onEnd(p);
            return;
        }

        if (events & UV_WRITABLE) {
            if (!socketData->messageQueue.empty() && (events & UV_WRITABLE)) {
                Socket(p).cork(true);
                while (true) {
                    SocketData::Queue::Message *messagePtr = socketData->messageQueue.front();
                    ssize_t sent = ::send(Socket(p).getFd(), messagePtr->data, messagePtr->length, MSG_NOSIGNAL);
                    if (sent == (ssize_t) messagePtr->length) {
                        if (messagePtr->callback) {
                            messagePtr->callback(p, messagePtr->callbackData, false, messagePtr->reserved);
                        }
                        socketData->messageQueue.pop();
                        if (socketData->messageQueue.empty()) {
                            // todo, remove bit, don't set directly
                            socketData->poll = UV_READABLE;
                            uv_poll_start(p, UV_READABLE, Socket(p).getPollCallback());
                            break;
                        }
                    } else if (sent == SOCKET_ERROR) {
                        if (errno != EWOULDBLOCK) {
                            STATE::onEnd(p);
                            return;
                        }
                        break;
                    } else {
                        messagePtr->length -= sent;
                        messagePtr->data += sent;
                        break;
                    }
                }
                Socket(p).cork(false);
            }
        }

        if (events & UV_READABLE) {
            int length = recv(Socket(p).getFd(), nodeData->recvBuffer, nodeData->recvLength, 0);
            if (length > 0) {
                STATE::onData(p, nodeData->recvBuffer, length);
            } else if (length <= 0 || (length == SOCKET_ERROR && errno != EWOULDBLOCK)) {
                STATE::onEnd(p);
            }
        }

    }